

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O1

void __thiscall
KosarajuSCC::topological_sort
          (KosarajuSCC *this,int u,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *ends,queue<int,_std::deque<int,_std::allocator<int>_>_> *sort,
          vector<bool,_std::allocator<bool>_> *seen)

{
  ulong *puVar1;
  int u_00;
  pointer pvVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  pointer piVar6;
  uint uVar7;
  int local_44;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  KosarajuSCC *local_38;
  
  uVar5 = (ulong)u;
  uVar4 = uVar5 + 0x3f;
  if (-1 < (long)uVar5) {
    uVar4 = uVar5;
  }
  puVar1 = (seen->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar4 >> 6) +
           (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar2 = (out->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar6 = pvVar2[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_44 = u;
  local_38 = this;
  if (*(pointer *)
       ((long)&pvVar2[u].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar6) {
    uVar7 = 1;
    uVar4 = 0;
    local_40 = out;
    do {
      u_00 = *(int *)(*(long *)&(ends->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[piVar6[uVar4]].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + 4);
      uVar5 = (ulong)u_00;
      uVar4 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar4 = uVar5;
      }
      if (((seen->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar4 >> 6) +
            (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar5 & 0x3f) & 1) == 0) {
        topological_sort(local_38,u_00,out,ends,sort,seen);
        out = local_40;
      }
      uVar4 = (ulong)uVar7;
      pvVar2 = (out->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar6 = pvVar2[local_44].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar4 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar2[local_44].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar6 >> 2));
  }
  piVar3 = (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar3 == (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)sort,&local_44);
  }
  else {
    *piVar3 = local_44;
    (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_cur = piVar3 + 1;
  }
  return;
}

Assistant:

void KosarajuSCC::topological_sort(int u, std::vector<std::vector<int> >& out,
																	 std::vector<std::vector<int> >& ends, std::queue<int>& sort,
																	 std::vector<bool>& seen) {
	seen[u] = true;
	for (unsigned int i = 0; i < out[u].size(); ++i) {
		const int e = out[u][i];
		const int v = ends[e][1];
		if (!seen[v]) {
			topological_sort(v, out, ends, sort, seen);
		}
	}
	sort.push(u);
}